

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti.c
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  qrk_t *qrk;
  ushort *puVar2;
  int iVar3;
  rdr_t *rdr;
  mdl_t *mdl;
  FILE *pFVar4;
  FILE *__stream;
  char *pcVar5;
  char *pcVar6;
  ushort **ppuVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  double *pdVar10;
  dat_t *pdVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  char **ppcVar18;
  anon_struct_16_2_f83984a8 *paVar19;
  uint64_t uVar20;
  bool bVar21;
  char *toks [4];
  opt_t opt;
  double local_160;
  char *local_158 [5];
  qrk_t *local_130;
  uint64_t local_128;
  opt_t local_120;
  
  memcpy(&local_120,&opt_defaults,0xf0);
  opt_parse(argc,argv,&local_120);
  rdr = rdr_new(local_120.maxent);
  mdl = mdl_new(rdr);
  mdl->opt = &local_120;
  switch(local_120.mode) {
  case 0:
    iVar3 = strcmp(local_120.type,"list");
    if (iVar3 == 0) {
      info("Available types of models:\n");
      lVar12 = 0;
      do {
        info("\t%s\n",*(undefined8 *)((long)typ_lst + lVar12));
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x18);
LAB_00110479:
      exit(0);
    }
    iVar3 = strcmp(local_120.algo,"list");
    if (iVar3 == 0) {
      info("Available training algorithms:\n");
      lVar12 = 0;
      do {
        info("\t%s\n",*(undefined8 *)((long)&trn_lst[0].name + lVar12));
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x60);
      goto LAB_00110479;
    }
    ppcVar18 = typ_lst;
    lVar12 = 0;
    do {
      iVar3 = strcmp(local_120.type,*ppcVar18);
      if (iVar3 == 0) goto LAB_0010f8e2;
      lVar12 = lVar12 + 1;
      ppcVar18 = ppcVar18 + 1;
    } while (lVar12 != 3);
    lVar12 = 3;
LAB_0010f8e2:
    if ((uint32_t)lVar12 == 3) {
      fatal("unknown model type \'%s\'",local_120.type);
    }
    mdl->type = (uint32_t)lVar12;
    pcVar6 = mdl->opt->algo;
    paVar19 = trn_lst;
    uVar17 = 0;
    do {
      iVar3 = strcmp(pcVar6,paVar19->name);
      if (iVar3 == 0) goto LAB_0010f931;
      uVar17 = uVar17 + 1;
      paVar19 = paVar19 + 1;
    } while (uVar17 != 6);
    uVar17 = 6;
LAB_0010f931:
    if ((int)uVar17 == 6) {
      fatal("unknown algorithm \'%s\'",pcVar6);
    }
    if (mdl->opt->model != (char *)0x0) {
      info("* Load previous model\n");
      pFVar4 = fopen(mdl->opt->model,"r");
      if (pFVar4 == (FILE *)0x0) {
        pfatal("cannot open input model file");
      }
      mdl_load(mdl,(FILE *)pFVar4);
      fclose(pFVar4);
    }
    if (mdl->opt->pattern != (char *)0x0) {
      info("* Load patterns\n");
      pFVar4 = fopen(mdl->opt->pattern,"r");
      if (pFVar4 == (FILE *)0x0) {
        pfatal("cannot open pattern file");
      }
      rdr_loadpat(mdl->reader,(FILE *)pFVar4);
      fclose(pFVar4);
      qrk_lock(mdl->reader->obs,false);
    }
    info("* Load training data\n");
    pcVar6 = mdl->opt->input;
    pFVar4 = _stdin;
    if ((pcVar6 != (char *)0x0) && (pFVar4 = fopen(pcVar6,"r"), pFVar4 == (FILE *)0x0)) {
      pfatal("cannot open input data file");
      pFVar4 = (FILE *)0x0;
    }
    pdVar11 = rdr_readdat(mdl->reader,(FILE *)pFVar4,true);
    mdl->train = pdVar11;
    if (mdl->opt->input != (char *)0x0) {
      fclose(pFVar4);
    }
    qrk_lock(mdl->reader->lbl,true);
    qrk_lock(mdl->reader->obs,true);
    if ((mdl->train == (dat_t *)0x0) || (mdl->train->nseq == 0)) {
      fatal("no train data loaded");
    }
    if (mdl->opt->devel != (char *)0x0) {
      info("* Load development data\n");
      pFVar4 = fopen(mdl->opt->devel,"r");
      if (pFVar4 == (FILE *)0x0) {
        pfatal("cannot open development file");
      }
      pdVar11 = rdr_readdat(mdl->reader,(FILE *)pFVar4,true);
      mdl->devel = pdVar11;
      fclose(pFVar4);
    }
    pcVar6 = "* Resync the model\n";
    if (mdl->theta == (double *)0x0) {
      pcVar6 = "* Initialize the model\n";
    }
    info(pcVar6);
    mdl_sync(mdl);
    info("* Summary\n");
    info("    nb train:    %u\n",(ulong)mdl->train->nseq);
    if (mdl->devel != (dat_t *)0x0) {
      info("    nb devel:    %u\n",(ulong)mdl->devel->nseq);
    }
    info("    nb labels:   %u\n",(ulong)mdl->nlbl);
    info("    nb blocks:   %lu\n",mdl->nobs);
    info("    nb features: %lu\n",mdl->nftr);
    info("* Train the model with %s\n",mdl->opt->algo);
    uit_setup(mdl);
    (*trn_lst[uVar17 & 0xffffffff].train)(mdl);
    uit_cleanup(mdl);
    break;
  case 1:
    if (local_120.model == (char *)0x0) {
      fatal("you must specify a model");
    }
    info("* Load model\n");
    pFVar4 = fopen(mdl->opt->model,"r");
    if (pFVar4 == (FILE *)0x0) {
      pfatal("cannot open input model file");
    }
    mdl_load(mdl,(FILE *)pFVar4);
    fclose(pFVar4);
    pFVar4 = _stdout;
    pcVar6 = mdl->opt->input;
    __stream = _stdin;
    if ((pcVar6 != (char *)0x0) && (__stream = fopen(pcVar6,"r"), __stream == (FILE *)0x0)) {
      pfatal("cannot open input data file");
      __stream = (FILE *)0x0;
    }
    pcVar6 = mdl->opt->output;
    if ((pcVar6 != (char *)0x0) && (pFVar4 = fopen(pcVar6,"w"), pFVar4 == (FILE *)0x0)) {
      pFVar4 = (FILE *)0x0;
      pfatal("cannot open output data file");
    }
    info("* Label sequences\n");
    tag_label(mdl,(FILE *)__stream,(FILE *)pFVar4);
    info("* Done\n");
    if (mdl->opt->input != (char *)0x0) {
      fclose(__stream);
    }
    goto LAB_00110150;
  case 2:
    info("* Load model\n");
    pcVar6 = mdl->opt->input;
    pFVar4 = _stdin;
    if ((pcVar6 != (char *)0x0) && (pFVar4 = fopen(pcVar6,"r"), pFVar4 == (FILE *)0x0)) {
      pfatal("cannot open input data file");
      pFVar4 = (FILE *)0x0;
    }
    mdl_load(mdl,(FILE *)pFVar4);
    if (mdl->opt->input != (char *)0x0) {
      fclose(pFVar4);
    }
    pcVar6 = mdl->opt->output;
    pFVar4 = _stdout;
    if ((pcVar6 != (char *)0x0) && (pFVar4 = fopen(pcVar6,"w"), pFVar4 == (FILE *)0x0)) {
      pfatal("cannot open output data file");
      pFVar4 = (FILE *)0x0;
    }
    info("* Dump model\n");
    uVar16 = mdl->nlbl;
    uVar17 = (ulong)uVar16;
    uVar8 = mdl->nobs;
    qrk = mdl->reader->lbl;
    local_130 = mdl->reader->obs;
    sprintf((char *)local_158,"%%.%df\n",(ulong)(uint)mdl->opt->prec);
    local_128 = uVar8;
    if (uVar8 != 0) {
      uVar8 = 0;
      do {
        pcVar6 = qrk_id2str(local_130,uVar8);
        bVar21 = true;
        if (((mdl->kind[uVar8] & 1U) != 0) && (bVar21 = true, uVar17 != 0)) {
          uVar20 = mdl->uoff[uVar8];
          pdVar10 = mdl->theta;
          bVar21 = true;
          uVar9 = 0;
          do {
            if (((mdl->opt->all != false) || (dVar1 = pdVar10[uVar20 + uVar9], dVar1 != 0.0)) ||
               (NAN(dVar1))) {
              pcVar13 = qrk_id2str(qrk,uVar9);
              bVar21 = false;
              fprintf(pFVar4,"%s\t#\t%s\t",pcVar6,pcVar13);
              fprintf(pFVar4,(char *)local_158,pdVar10[uVar20 + uVar9]);
            }
            uVar9 = uVar9 + 1;
          } while (uVar17 != uVar9);
        }
        if (((mdl->kind[uVar8] & 2U) != 0) && ((ulong)(uVar16 * uVar16) != 0)) {
          uVar20 = mdl->boff[uVar8];
          pdVar10 = mdl->theta;
          uVar14 = 0;
          do {
            if (((mdl->opt->all != false) || (dVar1 = pdVar10[uVar20 + uVar14], dVar1 != 0.0)) ||
               (NAN(dVar1))) {
              bVar21 = false;
              pcVar13 = qrk_id2str(qrk,(uVar14 & 0xffffffff) % uVar17);
              pcVar5 = qrk_id2str(qrk,(uVar14 & 0xffffffff) / uVar17);
              fprintf(pFVar4,"%s\t%s\t%s\t",pcVar6,pcVar5,pcVar13);
              fprintf(pFVar4,(char *)local_158,pdVar10[uVar20 + uVar14]);
            }
            uVar14 = uVar14 + 1;
          } while (uVar16 * uVar16 != uVar14);
        }
        if (!bVar21) {
          fputc(10,pFVar4);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != local_128);
    }
LAB_00110150:
    if (mdl->opt->output != (char *)0x0) {
      fclose(pFVar4);
    }
    goto switchD_0010f87b_default;
  case 3:
    info("* Load model\n");
    if (mdl->opt->model == (char *)0x0) {
      fatal("no model file provided");
    }
    pFVar4 = fopen(mdl->opt->model,"r");
    if (pFVar4 == (FILE *)0x0) {
      pfatal("cannot open model file %s",mdl->opt->model);
    }
    mdl_load(mdl,(FILE *)pFVar4);
    fclose(pFVar4);
    info("* Update model\n");
    pcVar6 = mdl->opt->input;
    pFVar4 = _stdin;
    if ((pcVar6 != (char *)0x0) && (pFVar4 = fopen(pcVar6,"r"), pFVar4 == (FILE *)0x0)) {
      pfatal("cannot open update file");
      pFVar4 = (FILE *)0x0;
    }
    uVar16 = 0;
    do {
      iVar3 = feof(pFVar4);
      if (iVar3 != 0) break;
      pcVar6 = rdr_readline((FILE *)pFVar4);
      if (pcVar6 != (char *)0x0) {
        uVar16 = uVar16 + 1;
        ppuVar7 = __ctype_b_loc();
        lVar12 = 0;
        pcVar13 = pcVar6;
        do {
          puVar2 = *ppuVar7;
          pcVar13 = pcVar13 + -1;
          do {
            pcVar5 = pcVar13 + 1;
            pcVar13 = pcVar13 + 1;
          } while ((*(byte *)((long)puVar2 + (long)*pcVar5 * 2 + 1) & 0x20) != 0);
          if (*pcVar5 == '\0') goto LAB_0010ff49;
          local_158[lVar12] = pcVar13;
          lVar12 = lVar12 + 1;
          lVar15 = (long)*pcVar13;
          bVar21 = lVar15 == 0;
          if (bVar21) goto LAB_0010ff49;
          while ((*(byte *)((long)puVar2 + lVar15 * 2 + 1) & 0x20) == 0) {
            lVar15 = (long)pcVar13[1];
            bVar21 = lVar15 == 0;
            if (bVar21) goto LAB_0010ff49;
            pcVar13 = pcVar13 + 1;
          }
          if (bVar21) goto LAB_0010ff49;
          *pcVar13 = '\0';
          pcVar13 = pcVar13 + 1;
        } while (lVar12 != 4);
        lVar12 = 4;
LAB_0010ff49:
        if ((int)lVar12 == 4) {
          uVar8 = qrk_str2id(mdl->reader->obs,local_158[0]);
          pcVar13 = local_158[1];
          if (uVar8 == 0xffffffffffffffff) {
            fatal("bad on observation on line %d",(ulong)uVar16);
          }
          iVar3 = strcmp(local_158[1],"#");
          uVar20 = 0xffffffffffffffff;
          if ((iVar3 != 0) &&
             (uVar20 = qrk_str2id(mdl->reader->lbl,pcVar13), uVar20 == 0xffffffffffffffff)) {
            fatal("bad label <%s> line %d",pcVar13,(ulong)uVar16);
          }
          pcVar13 = local_158[2];
          uVar9 = qrk_str2id(mdl->reader->lbl,local_158[2]);
          if (uVar9 == 0xffffffffffffffff) {
            fatal("bad label <%s> line %d",pcVar13,(ulong)uVar16);
          }
          local_160 = 0.0;
          iVar3 = __isoc99_sscanf(local_158[3],"%lf",&local_160);
          if (iVar3 != 1) {
            fatal("bad weight on line %d",(ulong)uVar16);
          }
          if (uVar20 == 0xffffffffffffffff) {
            pdVar10 = mdl->theta + mdl->uoff[uVar8];
          }
          else {
            pdVar10 = mdl->theta + mdl->boff[uVar8] + uVar20 * mdl->nlbl;
          }
          pdVar10[uVar9] = local_160;
        }
        else if ((int)lVar12 != 0) {
          fatal("invalid line at %d",(ulong)uVar16);
        }
        free(pcVar6);
      }
    } while (pcVar6 != (char *)0x0);
    if (mdl->opt->input != (char *)0x0) {
      fclose(pFVar4);
    }
    break;
  default:
    goto switchD_0010f87b_default;
  }
  if (mdl->opt->compact == true) {
    uVar8 = mdl->nobs;
    uVar20 = mdl->nftr;
    info("* Compacting the model\n");
    mdl_compact(mdl);
    info("    %8lu observations removed\n",uVar8 - mdl->nobs);
    info("    %8lu features removed\n",uVar20 - mdl->nftr);
  }
  info("* Save the model\n");
  pcVar6 = mdl->opt->output;
  pFVar4 = _stdout;
  if ((pcVar6 != (char *)0x0) && (pFVar4 = fopen(pcVar6,"w"), pFVar4 == (FILE *)0x0)) {
    pfatal("cannot open output model");
    pFVar4 = (FILE *)0x0;
  }
  mdl_save(mdl,(FILE *)pFVar4);
  if (mdl->opt->output != (char *)0x0) {
    fclose(pFVar4);
  }
  info("* Done\n");
switchD_0010f87b_default:
  mdl_free(mdl);
  return 0;
}

Assistant:

int main(int argc, char *argv[argc]) {
	// We first parse command line switchs
	opt_t opt = opt_defaults;
	opt_parse(argc, argv, &opt);
	// Next we prepare the model
	mdl_t *mdl = mdl_new(rdr_new(opt.maxent));
	mdl->opt = &opt;
	// And switch to requested mode
	switch (opt.mode) {
		case 0: dotrain(mdl); break;
		case 1: dolabel(mdl); break;
		case 2: dodump(mdl);  break;
		case 3: doupdt(mdl);  break;
	}
	// And cleanup
	mdl_free(mdl);
	return EXIT_SUCCESS;
}